

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

size_t plot::utf8_string_width<char_const*>(char *first,char *last)

{
  char32_t __c;
  int iVar1;
  undefined4 extraout_var;
  undefined8 local_20;
  size_t width;
  char *last_local;
  char *first_local;
  
  local_20 = 0;
  for (last_local = first; last_local != last;
      last_local = detail::utf8_next<char_const*>(last_local,last)) {
    __c = detail::utf8_cp<char_const*>(last_local,last);
    iVar1 = detail::wcwidth(__c);
    local_20 = CONCAT44(extraout_var,iVar1) + local_20;
  }
  return local_20;
}

Assistant:

std::size_t utf8_string_width(Iterator first, Iterator last) {
    std::size_t width = 0;

    for (; first != last; first = detail::utf8_next(first, last))
        width += detail::wcwidth(detail::utf8_cp(first, last));

    return width;
}